

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O3

_Bool rcnb_decode_byte(wchar_t *value_in,char **value_out)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  uVar3 = 0xffffffff;
  lVar6 = 0x3c;
  lVar7 = 0;
  do {
    if (L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[lVar7] == *value_in) {
      uVar3 = (uint)lVar7;
      break;
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + -4;
  } while (lVar6 != 0);
  iVar4 = 0xf;
  lVar7 = 0x3c;
  lVar6 = 0;
  do {
    if (L"cCĆćĈĉĊċČčƇƈÇȻȼ"[lVar6] == value_in[1]) {
      if (-1 < (int)(uVar3 | (uint)lVar6)) {
        bVar2 = false;
        goto LAB_001018b8;
      }
      break;
    }
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + -4;
  } while (lVar7 != 0);
  uVar3 = 0xffffffff;
  lVar6 = 0x3c;
  lVar7 = 0;
  do {
    if (L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[lVar7] == *value_in) {
      uVar3 = (uint)lVar7;
      break;
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + -4;
  } while (lVar6 != 0);
  lVar7 = 0x28;
  lVar6 = 0;
  while (L"bBƀƁƃƄƅßÞþ"[lVar6] != value_in[1]) {
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + -4;
    if (lVar7 == 0) {
      return false;
    }
  }
  bVar2 = true;
LAB_001018b8:
  if (-1 < (int)(uVar3 | (uint)lVar6)) {
    if (bVar2) {
      iVar4 = 10;
    }
    uVar3 = uVar3 * iVar4 + (uint)lVar6;
    if (uVar3 < 0x80) {
      uVar5 = (uint)(byte)((byte)uVar3 | 0x80);
      if (!bVar2) {
        uVar5 = uVar3;
      }
      pcVar1 = *value_out;
      *value_out = pcVar1 + 1;
      *pcVar1 = (char)uVar5;
      return true;
    }
  }
  return false;
}

Assistant:

bool rcnb_decode_byte(const wchar_t* value_in, char** value_out)
{
    bool nb = false;
    int idx[2] = { find(cr, sr, *value_in), find(cc, sc, *(value_in + 1)) };
    if (idx[0] < 0 || idx[1] < 0) {
        idx[0] = find(cn, sn, *value_in);
        idx[1] = find(cb, sb, *(value_in + 1));
        nb = true;
    }
    if (idx[0] < 0 || idx[1] < 0)
        return false;
    int result = nb ? idx[0] * sb + idx[1] : idx[0] * sc + idx[1];
    if (result > 0x7F)
        return false;
    *(*value_out)++ = (char)(nb ? result | 0x80 : result);
    return true;
}